

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRoundedRectangleProfileDef::IfcRoundedRectangleProfileDef
          (IfcRoundedRectangleProfileDef *this)

{
  IfcRoundedRectangleProfileDef *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xa8,"IfcRoundedRectangleProfileDef");
  IfcRectangleProfileDef::IfcRectangleProfileDef
            (&this->super_IfcRectangleProfileDef,&PTR_construction_vtable_24__00f911f8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoundedRectangleProfileDef,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoundedRectangleProfileDef,_1UL> *)
             &(this->super_IfcRectangleProfileDef).field_0x90,&PTR_construction_vtable_24__00f91270)
  ;
  (this->super_IfcRectangleProfileDef).super_IfcParameterizedProfileDef.super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)0xf91140;
  *(undefined8 *)&this->field_0xa8 = 0xf911e0;
  *(undefined8 *)
   &(this->super_IfcRectangleProfileDef).super_IfcParameterizedProfileDef.super_IfcProfileDef.
    field_0x58 = 0xf91168;
  *(undefined8 *)&(this->super_IfcRectangleProfileDef).super_IfcParameterizedProfileDef.field_0x70 =
       0xf91190;
  *(undefined8 *)&(this->super_IfcRectangleProfileDef).field_0x90 = 0xf911b8;
  return;
}

Assistant:

IfcRoundedRectangleProfileDef() : Object("IfcRoundedRectangleProfileDef") {}